

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall Matrix::operator*(Matrix *this,Matrix *other)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  runtime_error *this_00;
  long *in_RDX;
  int j;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  Matrix MVar15;
  
  Matrix(this,other->rows,*(int *)((long)in_RDX + 0xc));
  uVar1 = other->cols;
  if (uVar1 == *(uint *)(in_RDX + 1)) {
    uVar2 = *(uint *)((long)in_RDX + 0xc);
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    pdVar4 = this->data;
    uVar11 = (ulong)(uint)other->rows;
    if (other->rows < 1) {
      uVar11 = uVar7;
    }
    iVar3 = this->cols;
    MVar15._8_8_ = (long)(int)uVar2 * 8;
    for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      lVar13 = 0;
      for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
        pdVar5 = (double *)(*in_RDX + lVar13);
        dVar14 = 0.0;
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          dVar14 = dVar14 + *(double *)((long)other->data + uVar10 * 8 + uVar7) * *pdVar5;
          pdVar5 = pdVar5 + (int)uVar2;
        }
        pdVar4[uVar12 * (long)iVar3 + uVar6] = dVar14;
        lVar13 = lVar13 + 8;
      }
      uVar7 = uVar7 + (long)(int)uVar1 * 8;
    }
    MVar15.data = (double *)this;
    return MVar15;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix Matrix::operator*(const Matrix& other) const
{
    Matrix product = Matrix(rows, other.cols);

    if (cols != other.rows)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    for (int i = 0; i < rows; ++i)
    {
        for (int j = 0; j < other.cols; ++j)
        {
            double ij = 0;
            for (int k = 0; k < cols; ++k)
            {
                ij += this->operator()(i, k) * other(k, j);
            }
            product(i, j) = ij;
        }
    }

    return product;
}